

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void ExtractRotationSampler
               (Asset *asset,string *animId,Ref<glTF2::Buffer> *buffer,aiNodeAnim *nodeChannel,
               float ticksPerSecond,Sampler *sampler)

{
  value_type vVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  aiQuatKey *paVar5;
  reference pvVar6;
  Ref<glTF2::Accessor> RVar7;
  aiQuatKey *key;
  uint i;
  vector<float,_std::allocator<float>_> values;
  allocator<float> local_59;
  undefined1 local_58 [8];
  vector<float,_std::allocator<float>_> times;
  uint numKeyframes;
  Sampler *sampler_local;
  float ticksPerSecond_local;
  aiNodeAnim *nodeChannel_local;
  Ref<glTF2::Buffer> *buffer_local;
  string *animId_local;
  Asset *asset_local;
  
  times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = nodeChannel->mNumRotationKeys;
  if (times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ != 0) {
    uVar4 = (ulong)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<float>::allocator(&local_59);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_58,uVar4,&local_59);
    std::allocator<float>::~allocator(&local_59);
    uVar3 = times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ << 2;
    std::allocator<float>::allocator((allocator<float> *)((long)&key + 7));
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&i,(ulong)uVar3,
               (allocator<float> *)((long)&key + 7));
    std::allocator<float>::~allocator((allocator<float> *)((long)&key + 7));
    for (key._0_4_ = 0;
        (uint)key <
        times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; key._0_4_ = (uint)key + 1) {
      paVar5 = nodeChannel->mRotationKeys + (uint)key;
      dVar2 = paVar5->mTime;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_58,(ulong)(uint)key);
      *pvVar6 = (float)(dVar2 / (double)ticksPerSecond);
      vVar1 = (paVar5->mValue).x;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(ulong)((uint)key << 2));
      *pvVar6 = vVar1;
      vVar1 = (paVar5->mValue).y;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(ulong)((uint)key * 4 + 1));
      *pvVar6 = vVar1;
      vVar1 = (paVar5->mValue).z;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(ulong)((uint)key * 4 + 2));
      *pvVar6 = vVar1;
      vVar1 = (paVar5->mValue).w;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(ulong)((uint)key * 4 + 3));
      *pvVar6 = vVar1;
    }
    RVar7 = GetSamplerInputRef(asset,animId,buffer,(vector<float,_std::allocator<float>_> *)local_58
                              );
    (sampler->input).index = RVar7.index;
    (sampler->input).vector = RVar7.vector;
    uVar4 = (ulong)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&i,0);
    RVar7 = ExportData(asset,animId,buffer,uVar4,pvVar6,VEC4,VEC4,ComponentType_FLOAT,false);
    (sampler->output).vector = RVar7.vector;
    (sampler->output).index = RVar7.index;
    sampler->interpolation = Interpolation_LINEAR;
    std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)&i)
    ;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_58);
  }
  return;
}

Assistant:

inline void ExtractRotationSampler(Asset& asset, std::string& animId, Ref<Buffer>& buffer, const aiNodeAnim* nodeChannel, float ticksPerSecond, Animation::Sampler& sampler)
{
    const unsigned int numKeyframes = nodeChannel->mNumRotationKeys;
    if (numKeyframes == 0) {
        return;
    }

    std::vector<float> times(numKeyframes);
    std::vector<float> values(numKeyframes * 4);
    for (unsigned int i = 0; i < numKeyframes; ++i) {
        const aiQuatKey& key = nodeChannel->mRotationKeys[i];
        // mTime is measured in ticks, but GLTF time is measured in seconds, so convert.
        times[i] = static_cast<float>(key.mTime / ticksPerSecond);
        values[(i * 4) + 0] = key.mValue.x;
        values[(i * 4) + 1] = key.mValue.y;
        values[(i * 4) + 2] = key.mValue.z;
        values[(i * 4) + 3] = key.mValue.w;
    }

    sampler.input = GetSamplerInputRef(asset, animId, buffer, times);
    sampler.output = ExportData(asset, animId, buffer, numKeyframes, &values[0], AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    sampler.interpolation = Interpolation_LINEAR;
}